

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleScrollAdapter.cpp
# Opt level: O3

void __thiscall
cursespp::SimpleScrollAdapter::AddEntry
          (SimpleScrollAdapter *this,shared_ptr<cursespp::IScrollAdapter::IEntry> *entry)

{
  element_type *peVar1;
  _Map_pointer ppsVar2;
  
  peVar1 = (entry->super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  (*peVar1->_vptr_IEntry[4])(peVar1,(this->super_ScrollAdapterBase).width);
  std::
  deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  ::push_back(&this->entries,entry);
  while (ppsVar2 = (this->entries).
                   super__Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node,
        this->maxEntries <
        ((long)(this->entries).
               super__Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)(this->entries).
               super__Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
        ((long)(this->entries).
               super__Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)(this->entries).
               super__Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
        ((((ulong)((long)ppsVar2 -
                  (long)(this->entries).
                        super__Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(ppsVar2 == (_Map_pointer)0x0)) * 0x20) {
    std::
    deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
    ::pop_front(&this->entries);
  }
  sigslot::signal1<cursespp::SimpleScrollAdapter_*,_sigslot::multi_threaded_local>::operator()
            (&this->Changed,this);
  return;
}

Assistant:

void SimpleScrollAdapter::AddEntry(std::shared_ptr<IEntry> entry) {
    entry->SetWidth(this->GetWidth());
    entries.push_back(entry);

    while (entries.size() > this->maxEntries) {
        entries.pop_front();
    }

    this->Changed(this);
}